

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceBundle *
ures_getByKey_63(UResourceBundle *resB,char *inKey,UResourceBundle *fillIn,UErrorCode *status)

{
  UBool UVar1;
  ResourceData *rdata;
  UResourceBundle *pUVar2;
  ResourceData *rd;
  int32_t t;
  int32_t type;
  char *key;
  UResourceDataEntry *realData;
  UErrorCode *pUStack_30;
  Resource res;
  UErrorCode *status_local;
  UResourceBundle *fillIn_local;
  char *inKey_local;
  UResourceBundle *resB_local;
  
  realData._4_4_ = 0xffffffff;
  key = (char *)0x0;
  status_local = (UErrorCode *)fillIn;
  if ((status == (UErrorCode *)0x0) ||
     (_t = (UResourceBundle *)inKey, pUStack_30 = status, fillIn_local = (UResourceBundle *)inKey,
     inKey_local = (char *)resB, UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    resB_local = (UResourceBundle *)status_local;
  }
  else if (inKey_local == (char *)0x0) {
    *pUStack_30 = U_ILLEGAL_ARGUMENT_ERROR;
    resB_local = (UResourceBundle *)status_local;
  }
  else {
    rd._4_4_ = *(uint *)(inKey_local + 0xac) >> 0x1c;
    if (((rd._4_4_ == 2) || (rd._4_4_ == 5)) || (rd._4_4_ == 4)) {
      realData._4_4_ =
           res_getTableItemByKey_63
                     ((ResourceData *)(inKey_local + 0x28),*(Resource *)(inKey_local + 0xac),
                      (int32_t *)&rd,(char **)&t);
      if (realData._4_4_ != 0xffffffff) {
        pUVar2 = init_resb_result((ResourceData *)(inKey_local + 0x28),realData._4_4_,(char *)_t,-1,
                                  *(UResourceDataEntry **)(inKey_local + 8),
                                  (UResourceBundle *)inKey_local,0,(UResourceBundle *)status_local,
                                  pUStack_30);
        return pUVar2;
      }
      _t = fillIn_local;
      if (inKey_local[0xb0] == '\x01') {
        rdata = getFallbackData((UResourceBundle *)inKey_local,(char **)&t,
                                (UResourceDataEntry **)&key,(Resource *)((long)&realData + 4),
                                pUStack_30);
        UVar1 = U_SUCCESS(*pUStack_30);
        if (UVar1 != '\0') {
          pUVar2 = init_resb_result(rdata,realData._4_4_,(char *)_t,-1,(UResourceDataEntry *)key,
                                    (UResourceBundle *)inKey_local,0,(UResourceBundle *)status_local
                                    ,pUStack_30);
          return pUVar2;
        }
        *pUStack_30 = U_MISSING_RESOURCE_ERROR;
      }
      else {
        *pUStack_30 = U_MISSING_RESOURCE_ERROR;
      }
    }
    else {
      *pUStack_30 = U_RESOURCE_TYPE_MISMATCH;
    }
    resB_local = (UResourceBundle *)status_local;
  }
  return resB_local;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 ures_getByKey(const UResourceBundle *resB, const char* inKey, UResourceBundle *fillIn, UErrorCode *status) {
    Resource res = RES_BOGUS;
    UResourceDataEntry *realData = NULL;
    const char *key = inKey;

    if (status==NULL || U_FAILURE(*status)) {
        return fillIn;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return fillIn;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        int32_t t;
        res = res_getTableItemByKey(&(resB->fResData), resB->fRes, &t, &key);
        if(res == RES_BOGUS) {
            key = inKey;
            if(resB->fHasFallback == TRUE) {
                const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
                if(U_SUCCESS(*status)) {
                  /* check if resB->fResPath gives the right name here */
                    return init_resb_result(rd, res, key, -1, realData, resB, 0, fillIn, status);
                } else {
                    *status = U_MISSING_RESOURCE_ERROR;
                }
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            return init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        }
    } 
#if 0
    /* this is a kind of TODO item. If we have an array with an index table, we could do this. */
    /* not currently */
    else if(RES_GET_TYPE(resB->fRes) == URES_ARRAY && resB->fHasFallback == TRUE) {
        /* here should go a first attempt to locate the key using index table */
        const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
        if(U_SUCCESS(*status)) {
            return init_resb_result(rd, res, key, realData, resB, fillIn, status);
        } else {
            *status = U_MISSING_RESOURCE_ERROR;
        }
    }
#endif    
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }